

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseEncoding(State *state)

{
  bool bVar1;
  undefined1 local_48 [8];
  State copy;
  State *state_local;
  
  copy._40_8_ = state;
  memcpy(local_48,state,0x30);
  bVar1 = ParseName((State *)copy._40_8_);
  if ((bVar1) && (bVar1 = ParseBareFunctionType((State *)copy._40_8_), bVar1)) {
    state_local._7_1_ = true;
  }
  else {
    memcpy((void *)copy._40_8_,local_48,0x30);
    bVar1 = ParseName((State *)copy._40_8_);
    if ((bVar1) || (bVar1 = ParseSpecialName((State *)copy._40_8_), bVar1)) {
      state_local._7_1_ = true;
    }
    else {
      state_local._7_1_ = false;
    }
  }
  return state_local._7_1_;
}

Assistant:

static bool ParseEncoding(State *state) {
  State copy = *state;
  if (ParseName(state) && ParseBareFunctionType(state)) {
    return true;
  }
  *state = copy;

  if (ParseName(state) || ParseSpecialName(state)) {
    return true;
  }
  return false;
}